

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

void __thiscall cmCTestMultiProcessHandler::RunTests(cmCTestMultiProcessHandler *this)

{
  cmCTestTestHandler *pcVar1;
  bool bVar2;
  int iVar3;
  
  CheckResume(this);
  if (this->HasCycles == false) {
    pcVar1 = this->TestHandler;
    iVar3 = FindMaxIndex(this);
    pcVar1->MaxIndex = iVar3;
    while( true ) {
      StartNextTests(this);
      if ((this->Tests).
          super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
          ._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
        do {
          bVar2 = CheckOutput(this);
        } while (bVar2);
        MarkFinished(this);
        UpdateCostData(this);
        return;
      }
      if (this->StopTimePassed != false) break;
      CheckOutput(this);
    }
  }
  return;
}

Assistant:

void cmCTestMultiProcessHandler::RunTests()
{
  this->CheckResume();
  if(this->HasCycles)
    {
    return;
    }
  this->TestHandler->SetMaxIndex(this->FindMaxIndex());
  this->StartNextTests();
  while(!this->Tests.empty())
    {
    if(this->StopTimePassed)
      {
      return;
      }
    this->CheckOutput();
    this->StartNextTests();
    }
  // let all running tests finish
  while(this->CheckOutput())
    {
    }
  this->MarkFinished();
  this->UpdateCostData();
}